

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

void upb::generator::anon_unknown_1::GenerateMessageDefAccessor(MessageDefPtr d,Output *output)

{
  Output *pOVar1;
  char *__str;
  char *in_RCX;
  FileDefPtr file;
  string_view full_name;
  string_view local_d8;
  string_view local_c8;
  char *local_b8;
  string_view local_b0;
  upb_FileDef *local_a0;
  string local_98;
  string_view local_78 [2];
  basic_string_view<char,_std::char_traits<char>_> local_58;
  string local_48;
  string_view local_28;
  Output *local_18;
  Output *output_local;
  MessageDefPtr d_local;
  
  local_18 = output;
  output_local = (Output *)d.ptr_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,"UPB_INLINE const upb_MessageDef *$0(upb_DefPool *s) {\n");
  __str = MessageDefPtr::full_name((MessageDefPtr *)&output_local);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,__str);
  full_name._M_str = in_RCX;
  full_name._M_len = (size_t)local_58._M_str;
  ReflectionGetMessageSymbol_abi_cxx11_(&local_48,(generator *)local_58._M_len,full_name);
  Output::operator()(output,local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  pOVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_78,"  _upb_DefPool_LoadDefInit(s, &$0);\n");
  local_a0 = (upb_FileDef *)MessageDefPtr::file((MessageDefPtr *)&output_local);
  (anonymous_namespace)::DefInitSymbol_abi_cxx11_(&local_98,(_anonymous_namespace_ *)local_a0,file);
  Output::operator()(pOVar1,local_78[0],&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  pOVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_b0,"  return upb_DefPool_FindMessageByName(s, \"$0\");\n");
  local_b8 = MessageDefPtr::full_name((MessageDefPtr *)&output_local);
  Output::operator()(pOVar1,local_b0,&local_b8);
  pOVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c8,"}\n");
  Output::operator()<>(pOVar1,local_c8);
  pOVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d8,"\n");
  Output::operator()<>(pOVar1,local_d8);
  return;
}

Assistant:

void GenerateMessageDefAccessor(upb::MessageDefPtr d, Output& output) {
  output("UPB_INLINE const upb_MessageDef *$0(upb_DefPool *s) {\n",
         ReflectionGetMessageSymbol(d.full_name()));
  output("  _upb_DefPool_LoadDefInit(s, &$0);\n", DefInitSymbol(d.file()));
  output("  return upb_DefPool_FindMessageByName(s, \"$0\");\n", d.full_name());
  output("}\n");
  output("\n");
}